

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDLGraphicsSystem.cpp
# Opt level: O0

void __thiscall
solitaire::graphics::SDLGraphicsSystem::createWindow
          (SDLGraphicsSystem *this,string *title,uint width,uint height)

{
  runtime_error *this_00;
  UniquePtr<SDL_Renderer> local_80;
  UniquePtr<SDL_Window> local_58;
  uint local_20;
  uint local_1c;
  uint height_local;
  uint width_local;
  string *title_local;
  SDLGraphicsSystem *this_local;
  
  local_20 = height;
  local_1c = width;
  _height_local = title;
  title_local = (string *)this;
  if ((this->isWindowCreated & 1U) != 0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Window already created");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  initializeSDLOrQuitAndThrowError(this);
  createSDLWindowOrQuitAndThrowError(&local_58,this,_height_local,local_1c,local_20);
  std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>::operator=
            (&this->window,&local_58);
  std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>::~unique_ptr(&local_58);
  createSDLWindowRendererOrQuitAndThrowError(&local_80,this,&this->window);
  std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>::operator=
            (&this->renderer,&local_80);
  std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>::~unique_ptr(&local_80);
  this->isWindowCreated = true;
  return;
}

Assistant:

void SDLGraphicsSystem::createWindow(
    const std::string& title, const unsigned width, const unsigned height)
{
    if (isWindowCreated)
        throw std::runtime_error {"Window already created"};

    initializeSDLOrQuitAndThrowError();
    window = createSDLWindowOrQuitAndThrowError(title, width, height);
    renderer = createSDLWindowRendererOrQuitAndThrowError(window);
    isWindowCreated = true;
}